

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

void __thiscall
QDockAreaLayoutItem::QDockAreaLayoutItem(QDockAreaLayoutItem *this,QDockAreaLayoutItem *other)

{
  QDockAreaLayoutInfo *this_00;
  QPlaceHolderItem *pQVar1;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  QDockAreaLayoutInfo *in_stack_ffffffffffffffd8;
  QPlaceHolderItem *in_stack_ffffffffffffffe0;
  
  *in_RDI = *in_RSI;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  *(undefined4 *)(in_RDI + 3) = *(undefined4 *)(in_RSI + 3);
  *(undefined4 *)((long)in_RDI + 0x1c) = *(undefined4 *)((long)in_RSI + 0x1c);
  *(undefined4 *)(in_RDI + 4) = *(undefined4 *)(in_RSI + 4);
  if (in_RSI[1] == 0) {
    if (in_RSI[2] != 0) {
      pQVar1 = (QPlaceHolderItem *)operator_new(0x30);
      QPlaceHolderItem::QPlaceHolderItem(in_stack_ffffffffffffffe0,pQVar1);
      in_RDI[2] = pQVar1;
    }
  }
  else {
    this_00 = (QDockAreaLayoutInfo *)operator_new(0x70);
    QDockAreaLayoutInfo::QDockAreaLayoutInfo(this_00,in_stack_ffffffffffffffd8);
    in_RDI[1] = this_00;
  }
  return;
}

Assistant:

QDockAreaLayoutItem::QDockAreaLayoutItem(const QDockAreaLayoutItem &other)
    : widgetItem(other.widgetItem), subinfo(nullptr), placeHolderItem(nullptr), pos(other.pos),
        size(other.size), flags(other.flags)
{
    if (other.subinfo != nullptr)
        subinfo = new QDockAreaLayoutInfo(*other.subinfo);
    else if (other.placeHolderItem != nullptr)
        placeHolderItem = new QPlaceHolderItem(*other.placeHolderItem);
}